

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Accumulator.hpp
# Opt level: O0

vector<double,_std::allocator<double>_> * __thiscall
OpenMD::Utils::Accumulator<std::vector<double,_std::allocator<double>_>_>::
get95percentConfidenceInterval(Accumulator<std::vector<double,_std::allocator<double>_>_> *this)

{
  double dVar1;
  undefined8 uVar2;
  size_type sVar3;
  reference pvVar4;
  undefined8 *in_RSI;
  allocator_type *in_RDI;
  double dVar5;
  undefined1 auVar6 [16];
  size_t i;
  vector<double,_std::allocator<double>_> stdDev;
  vector<double,_std::allocator<double>_> *ci;
  allocator_type *this_00;
  ulong local_48;
  vector<double,_std::allocator<double>_> local_40;
  undefined7 in_stack_ffffffffffffffe8;
  undefined1 uVar7;
  byte bVar8;
  
  uVar7 = 0;
  this_00 = in_RDI;
  std::vector<double,_std::allocator<double>_>::size
            ((vector<double,_std::allocator<double>_> *)(in_RSI + 7));
  std::allocator<double>::allocator((allocator<double> *)0x3eaf1d);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)this_00,(size_type)in_RSI,in_RDI);
  std::allocator<double>::~allocator((allocator<double> *)0x3eaf3d);
  getStdDev((Accumulator<std::vector<double,_std::allocator<double>_>_> *)
            CONCAT17(uVar7,in_stack_ffffffffffffffe8));
  local_48 = 0;
  while( true ) {
    sVar3 = std::vector<double,_std::allocator<double>_>::size(&local_40);
    if (sVar3 <= local_48) break;
    pvVar4 = std::vector<double,_std::allocator<double>_>::operator[](&local_40,local_48);
    dVar1 = *pvVar4;
    uVar2 = *in_RSI;
    auVar6._8_4_ = (int)((ulong)uVar2 >> 0x20);
    auVar6._0_8_ = uVar2;
    auVar6._12_4_ = 0x45300000;
    dVar5 = sqrt((auVar6._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)uVar2) - 4503599627370496.0));
    pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)this_00,local_48);
    *pvVar4 = (dVar1 * 1.96) / dVar5;
    local_48 = local_48 + 1;
  }
  bVar8 = 1;
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)in_RDI);
  if ((bVar8 & 1) == 0) {
    std::vector<double,_std::allocator<double>_>::~vector
              ((vector<double,_std::allocator<double>_> *)in_RDI);
  }
  return (vector<double,_std::allocator<double>_> *)in_RDI;
}

Assistant:

std::vector<RealType> get95percentConfidenceInterval() const {
      std::vector<RealType> ci(Avg_.size());
      std::vector<RealType> stdDev = this->getStdDev();

      for (std::size_t i = 0; i < stdDev.size(); i++) {
        ci[i] = 1.960 * stdDev[i] / std::sqrt(static_cast<RealType>(Count_));
      }

      return ci;
    }